

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O2

Method SimpleServer::toMethod(string *method)

{
  bool bVar1;
  Method MVar2;
  
  bVar1 = std::operator==(method,"GET");
  MVar2 = GET;
  if (!bVar1) {
    bVar1 = std::operator==(method,"HEAD");
    if (bVar1) {
      MVar2 = HEAD;
    }
    else {
      bVar1 = std::operator==(method,"POST");
      if (bVar1) {
        MVar2 = POST;
      }
      else {
        bVar1 = std::operator==(method,"OPTIONS");
        if (bVar1) {
          MVar2 = OPTIONS;
        }
        else {
          bVar1 = std::operator==(method,"CONNECT");
          if (bVar1) {
            MVar2 = CONNECT;
          }
          else {
            bVar1 = std::operator==(method,"TRACE");
            if (bVar1) {
              MVar2 = TRACE;
            }
            else {
              bVar1 = std::operator==(method,"PUT");
              if (bVar1) {
                MVar2 = PUT;
              }
              else {
                bVar1 = std::operator==(method,"PATCH");
                if (bVar1) {
                  MVar2 = PATCH;
                }
                else {
                  bVar1 = std::operator==(method,"DELETE");
                  if (!bVar1) {
                    __assert_fail("false && \"INVALID METHOD\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lapinozz[P]SimpleServer/example/../include/SimpleServer/simpleserver.hpp"
                                  ,0xf5,"Method SimpleServer::toMethod(std::string)");
                  }
                  MVar2 = DELETE;
                }
              }
            }
          }
        }
      }
    }
  }
  return MVar2;
}

Assistant:

inline Method toMethod(std::string method)
	{
		if (method == "GET") return GET;
		else if (method == "HEAD") return HEAD;
		else if (method == "POST") return POST;
		else if (method == "OPTIONS") return OPTIONS;
		else if (method == "CONNECT") return CONNECT;
		else if (method == "TRACE") return TRACE;
		else if (method == "PUT") return PUT;
		else if (method == "PATCH") return PATCH;
		else if (method == "DELETE") return DELETE;

		assert(false && "INVALID METHOD");
	}